

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O0

FindInfo absl::lts_20250127::container_internal::HashSetResizeHelper::FindFirstNonFullAfterResize
                   (CommonFields *c,size_t old_capacity,size_t hash)

{
  bool bVar1;
  size_t new_capacity_00;
  ctrl_t *pcVar2;
  size_t sVar3;
  ulong local_50;
  size_t offset;
  size_t new_capacity;
  size_t hash_local;
  size_t old_capacity_local;
  CommonFields *c_local;
  size_t local_10;
  
  new_capacity_00 = CommonFields::capacity(c);
  bVar1 = IsGrowingIntoSingleGroupApplicable(old_capacity,new_capacity_00);
  if (bVar1) {
    pcVar2 = CommonFields::control(c);
    sVar3 = anon_unknown_2::SingleGroupTableH1(hash,pcVar2);
    if ((sVar3 & 1) == 0) {
      local_50 = new_capacity_00 - 1;
    }
    else {
      local_50 = 0;
    }
    pcVar2 = CommonFields::control(c);
    bVar1 = IsEmpty(pcVar2[local_50]);
    if (!bVar1) {
      __assert_fail("IsEmpty(c.control()[offset])",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                    ,0x263,
                    "static FindInfo absl::container_internal::HashSetResizeHelper::FindFirstNonFullAfterResize(const CommonFields &, size_t, size_t)"
                   );
    }
    local_10 = 0;
    c_local = (CommonFields *)local_50;
  }
  else {
    _c_local = find_first_non_full<void>(c,hash);
  }
  return _c_local;
}

Assistant:

FindInfo HashSetResizeHelper::FindFirstNonFullAfterResize(const CommonFields& c,
                                                          size_t old_capacity,
                                                          size_t hash) {
  size_t new_capacity = c.capacity();
  if (!IsGrowingIntoSingleGroupApplicable(old_capacity, new_capacity)) {
    return find_first_non_full(c, hash);
  }

  // We put the new element either at the beginning or at the end of the table
  // with approximately equal probability.
  size_t offset =
      SingleGroupTableH1(hash, c.control()) & 1 ? 0 : new_capacity - 1;

  assert(IsEmpty(c.control()[offset]));
  return FindInfo{offset, 0};
}